

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O0

undefined8 toString_abi_cxx11_(Range *range)

{
  ostream *poVar1;
  Range *in_RSI;
  undefined8 in_RDI;
  double dVar2;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [376];
  Range *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"[");
  dVar2 = SoapySDR::Range::minimum(local_10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  poVar1 = std::operator<<(poVar1,", ");
  dVar2 = SoapySDR::Range::maximum(local_10);
  std::ostream::operator<<(poVar1,dVar2);
  dVar2 = SoapySDR::Range::step(local_10);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    poVar1 = std::operator<<(local_188,", ");
    dVar2 = SoapySDR::Range::step(local_10);
    std::ostream::operator<<(poVar1,dVar2);
  }
  std::operator<<(local_188,"]");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string toString(const SoapySDR::Range &range)
{
    std::stringstream ss;
    ss << "[" << range.minimum() << ", " << range.maximum();
    if (range.step() != 0.0) ss << ", " << range.step();
    ss << "]";
    return ss.str();
}